

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * __thiscall
tinyformat::format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,ChainstateRole *args,
          unsigned_long *args_1,unsigned_long *args_2,long *args_3,int *args_4,int *args_5,
          int *args_6)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
            ((ostream *)local_1b0,(char *)this,(ChainstateRole *)fmt,(unsigned_long *)args,args_1,
             (long *)args_2,(int *)args_3,args_4,args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}